

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O3

void __thiscall ans_msb_decode::~ans_msb_decode(ans_msb_decode *this)

{
  pointer pdVar1;
  pointer puVar2;
  
  pdVar1 = (this->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->table).
                                 super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  puVar2 = (this->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->nfreqs).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    return;
  }
  return;
}

Assistant:

static ans_msb_decode load(const uint8_t* in_u8)
    {
        ans_msb_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                uint32_t except_bytes = ans_msb_exception_bytes(sym);
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num
                    = ans_msb_undo_mapping(sym) + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }